

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O1

void nn_aipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_ep *self_01;
  int errnum;
  int val;
  size_t sz;
  undefined1 local_2c [4];
  size_t local_28;
  
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) {
LAB_00134520:
      nn_aipc_handler_cold_12();
      goto LAB_00134525;
    }
    if (type == -2) {
      nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    break;
  case 2:
    if (src == 3) {
      if (type == 6) {
        self_01 = (nn_ep *)self[1].shutdown_fn;
        errnum = nn_usock_geterrno((nn_usock *)self[8].shutdown_fn);
        nn_ep_set_error(self_01,errnum);
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x6b,1);
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
        return;
      }
      goto LAB_00134552;
    }
    if (src != 1) goto LAB_00134538;
    if (type == 2) {
      nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
      local_28 = 4;
      nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,2,local_2c,&local_28);
      if (local_28 == 4) {
        self_00 = &self[1].state;
        nn_usock_setsockopt((nn_usock *)self_00,1,7,local_2c,4);
        local_28 = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,3,local_2c,&local_28);
        if (local_28 == 4) {
          nn_usock_setsockopt((nn_usock *)self_00,1,8,local_2c,4);
          nn_usock_swap_owner((nn_usock *)self[8].shutdown_fn,(nn_fsm_owner *)&self[8].state);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          self[8].state = -1;
          self[8].srcptr = (void *)0x0;
          nn_fsm_raise(self,(nn_fsm_event *)&self[0x13].stopped.type,0x85b7);
          nn_usock_activate((nn_usock *)self_00);
          nn_sipc_start((nn_sipc *)&self[8].owner,(nn_usock *)self_00);
          *(undefined4 *)&self[1].fn = 3;
          nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x66,1);
          return;
        }
      }
      else {
        nn_aipc_handler_cold_9();
      }
      nn_aipc_handler_cold_10();
      goto LAB_00134511;
    }
    goto LAB_0013454b;
  case 3:
    if (src != 2) {
LAB_00134516:
      nn_aipc_handler_cold_5();
LAB_0013451b:
      nn_aipc_handler_cold_3();
      goto LAB_00134520;
    }
    if (type == 1) {
      nn_sipc_stop((nn_sipc *)&self[8].owner);
      *(undefined4 *)&self[1].fn = 4;
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x68,1);
      return;
    }
LAB_00134525:
    nn_aipc_handler_cold_6();
    break;
  case 4:
    if (src != 2) goto LAB_0013451b;
    if (type == 8) {
      return;
    }
    if (type == 2) {
      nn_usock_stop((nn_usock *)&self[1].state);
      *(undefined4 *)&self[1].fn = 5;
      return;
    }
    goto LAB_00134544;
  case 5:
    if (src != 1) {
LAB_00134511:
      nn_aipc_handler_cold_1();
      goto LAB_00134516;
    }
    if (type == 8) {
      return;
    }
    if (type == 7) {
      nn_fsm_raise(self,(nn_fsm_event *)&self[0x14].srcptr,0x85b8);
      *(undefined4 *)&self[1].fn = 6;
      return;
    }
    goto LAB_0013453d;
  default:
    goto switchD_00134296_default;
  }
  nn_aipc_handler_cold_13();
switchD_00134296_default:
  nn_aipc_handler_cold_14();
LAB_00134538:
  nn_aipc_handler_cold_11();
LAB_0013453d:
  nn_aipc_handler_cold_2();
LAB_00134544:
  nn_aipc_handler_cold_4();
LAB_0013454b:
  nn_aipc_handler_cold_8();
LAB_00134552:
  nn_aipc_handler_cold_7();
}

Assistant:

static void nn_aipc_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aipc *aipc;
    int val;
    size_t sz;

    aipc = nn_cont (self, struct nn_aipc, fsm);

    switch (aipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aipc->usock, aipc->listener);
                aipc->state = NN_AIPC_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AIPC_STATE_ACCEPTING:
        switch (src) {

        case NN_AIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_ep_clear_error (aipc->ep);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_ep_getopt (aipc->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aipc->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aipc->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aipc->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aipc->listener, &aipc->listener_owner);
                aipc->listener = NULL;
                aipc->listener_owner.src = -1;
                aipc->listener_owner.fsm = NULL;
                nn_fsm_raise (&aipc->fsm, &aipc->accepted, NN_AIPC_ACCEPTED);

                /*  Start the sipc state machine. */
                nn_usock_activate (&aipc->usock);
                nn_sipc_start (&aipc->sipc, &aipc->usock);
                aipc->state = NN_AIPC_STATE_ACTIVE;

                nn_ep_stat_increment (aipc->ep,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        case NN_AIPC_SRC_LISTENER:
            switch (type) {
            case NN_USOCK_ACCEPT_ERROR:
                nn_ep_set_error (aipc->ep, nn_usock_geterrno (aipc->listener));
                nn_ep_stat_increment (aipc->ep, NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aipc->usock, aipc->listener);

                return;

            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AIPC_STATE_ACTIVE:
        switch (src) {

        case NN_AIPC_SRC_SIPC:
            switch (type) {
            case NN_SIPC_ERROR:
                nn_sipc_stop (&aipc->sipc);
                aipc->state = NN_AIPC_STATE_STOPPING_SIPC;
                nn_ep_stat_increment (aipc->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SIPC state.                                                      */
/******************************************************************************/
    case NN_AIPC_STATE_STOPPING_SIPC:
        switch (src) {

        case NN_AIPC_SRC_SIPC:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SIPC_STOPPED:
                nn_usock_stop (&aipc->usock);
                aipc->state = NN_AIPC_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                      */
/******************************************************************************/
    case NN_AIPC_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&aipc->fsm, &aipc->done, NN_AIPC_ERROR);
                aipc->state = NN_AIPC_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aipc->state, src, type);
    }
}